

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_ipf_core(pel *src,pel *dst,int i_dst,int flt_range_hor,int flt_range_ver,s8 *flt_hor_coef
                   ,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  pel pVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar1 = ~(-1 << ((byte)bit_depth & 0x1f));
  if (flt_range_ver < 1) {
    flt_range_ver = 0;
  }
  else {
    uVar7 = 0;
    do {
      iVar6 = (int)flt_ver_coef[uVar7];
      uVar5 = 0;
      if (0 < flt_range_hor) {
        uVar3 = 0;
        do {
          uVar2 = (int)((uint)dst[uVar3] * ((0x40 - iVar6) - (int)flt_hor_coef[uVar3]) +
                        (uint)src[uVar3 + 1] * iVar6 + (uint)src[~uVar7] * (int)flt_hor_coef[uVar3]
                       + 0x20) >> 6;
          uVar5 = uVar2;
          if ((int)uVar1 <= (int)uVar2) {
            uVar5 = uVar1;
          }
          pVar4 = (pel)uVar5;
          if ((int)uVar2 < 0) {
            pVar4 = '\0';
          }
          dst[uVar3] = pVar4;
          uVar3 = uVar3 + 1;
          uVar5 = flt_range_hor;
        } while ((uint)flt_range_hor != uVar3);
      }
      if ((int)uVar5 < w) {
        uVar3 = (ulong)uVar5;
        do {
          uVar2 = (int)((uint)src[uVar3 + 1] * iVar6 + (uint)dst[uVar3] * (0x40 - iVar6) + 0x20) >>
                  6;
          uVar5 = uVar1;
          if ((int)uVar2 < (int)uVar1) {
            uVar5 = uVar2;
          }
          pVar4 = (pel)uVar5;
          if ((int)uVar2 < 0) {
            pVar4 = '\0';
          }
          dst[uVar3] = pVar4;
          uVar3 = uVar3 + 1;
        } while ((uint)w != uVar3);
      }
      dst = dst + i_dst;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)flt_range_ver);
  }
  if (flt_range_ver < h) {
    uVar7 = (ulong)(uint)flt_range_ver;
    do {
      if (0 < flt_range_hor) {
        uVar3 = 0;
        do {
          uVar2 = (int)((uint)src[(int)~(uint)uVar7] * (int)flt_hor_coef[uVar3] +
                        (uint)dst[uVar3] * (0x40 - flt_hor_coef[uVar3]) + 0x20) >> 6;
          uVar5 = uVar2;
          if ((int)uVar1 <= (int)uVar2) {
            uVar5 = uVar1;
          }
          pVar4 = (pel)uVar5;
          if ((int)uVar2 < 0) {
            pVar4 = '\0';
          }
          dst[uVar3] = pVar4;
          uVar3 = uVar3 + 1;
        } while ((uint)flt_range_hor != uVar3);
      }
      dst = dst + i_dst;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)h);
  }
  return;
}

Assistant:

void ipred_ipf_core(pel *src, pel *dst, int i_dst, int flt_range_hor, int flt_range_ver, const s8* flt_hor_coef, const s8* flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;
        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
}